

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglbuffer.cpp
# Opt level: O3

ssize_t __thiscall QOpenGLBuffer::write(QOpenGLBuffer *this,int __fd,void *__buf,size_t __n)

{
  QOpenGLBufferPrivate *pQVar1;
  code *UNRECOVERED_JUMPTABLE;
  ssize_t sVar2;
  
  pQVar1 = this->d_ptr;
  if ((pQVar1->guard != (QOpenGLSharedResourceGuard *)0x0) && (*(int *)(pQVar1->guard + 0x10) != 0))
  {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar1->funcs + 0x1d0);
    sVar2 = (*UNRECOVERED_JUMPTABLE)
                      (pQVar1->type,(long)__fd,(long)(int)__n,__buf,UNRECOVERED_JUMPTABLE);
    return sVar2;
  }
  return (ssize_t)__buf;
}

Assistant:

void QOpenGLBuffer::write(int offset, const void *data, int count)
{
#ifndef QT_NO_DEBUG
    if (!isCreated())
        qWarning("QOpenGLBuffer::write(): buffer not created");
#endif
    Q_D(QOpenGLBuffer);
    if (d->guard && d->guard->id())
        d->funcs->glBufferSubData(d->type, offset, count, data);
}